

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void tcg_prologue_init_m68k(TCGContext_conflict2 *s)

{
  int iVar1;
  tcg_insn_unit *ptVar2;
  size_t sVar3;
  tcg_insn_unit *buf;
  long lVar4;
  bool bVar5;
  
  ptVar2 = (tcg_insn_unit *)s->code_gen_buffer;
  sVar3 = s->code_gen_buffer_size;
  s->code_ptr = ptVar2;
  s->code_buf = ptVar2;
  lVar4 = 0;
  s->data_gen_ptr = (void *)0x0;
  s->code_gen_prologue = ptVar2;
  s->code_gen_highwater = ptVar2 + (sVar3 - s->uc->qemu_real_host_page_size) + -0x400;
  s->pool_labels = (TCGLabelPoolData *)0x0;
  s->frame_start = 0x80;
  s->frame_end = 0x480;
  iVar1 = s->nb_globals;
  s->nb_globals = iVar1 + 1;
  s->nb_temps = iVar1 + 1;
  s->temps[iVar1].mem_offset = 0;
  s->temps[iVar1].name = (char *)0x0;
  s->temps[iVar1].state = 0;
  s->temps[iVar1].state_ptr = (void *)0x0;
  s->temps[iVar1].val = 0;
  s->temps[iVar1].mem_base = (TCGTemp *)0x0;
  *(undefined8 *)(s->temps + iVar1) = 0x2101010004;
  s->temps[iVar1].name = "_frame";
  *(byte *)&s->reserved_regs = (byte)s->reserved_regs | 0x10;
  s->frame_temp = s->temps + iVar1;
  do {
    tcg_out_opc(s,*(uint *)((long)tcg_target_callee_save_regs + lVar4) & 7 | 0x50,0,
                *(uint *)((long)tcg_target_callee_save_regs + lVar4),0);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x18);
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 'H';
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 0x8b;
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 0xef;
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 'H';
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 0x81;
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 0xc4;
  ptVar2 = s->code_ptr;
  ptVar2[0] = 'x';
  ptVar2[1] = 0xfb;
  ptVar2[2] = 0xff;
  ptVar2[3] = 0xff;
  s->code_ptr = ptVar2 + 5;
  ptVar2[4] = 0xff;
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 0xe6;
  ptVar2 = s->code_ptr;
  s->code_gen_epilogue = ptVar2;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = '3';
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 0xc0;
  ptVar2 = s->code_ptr;
  s->tb_ret_addr = ptVar2;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 'H';
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 0x81;
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 0xc4;
  ptVar2 = s->code_ptr;
  ptVar2[0] = 0x88;
  ptVar2[1] = '\x04';
  ptVar2[2] = '\0';
  ptVar2[3] = '\0';
  s->code_ptr = ptVar2 + 4;
  if (have_avx2_m68k == true) {
    s->code_ptr = ptVar2 + 5;
    ptVar2[4] = 0xc5;
    ptVar2 = s->code_ptr;
    s->code_ptr = ptVar2 + 1;
    *ptVar2 = 0xf8;
    ptVar2 = s->code_ptr;
    s->code_ptr = ptVar2 + 1;
    *ptVar2 = 'w';
  }
  lVar4 = 5;
  do {
    tcg_out_opc(s,tcg_target_callee_save_regs[lVar4] & 7U | 0x58,0,
                tcg_target_callee_save_regs[lVar4],0);
    bVar5 = lVar4 != 0;
    lVar4 = lVar4 + -1;
  } while (bVar5);
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = 0xc3;
  tcg_out_pool_finalize(s);
  ptVar2 = s->code_buf;
  buf = s->code_ptr;
  s->code_gen_ptr = buf;
  s->code_gen_buffer = buf;
  s->code_buf = buf;
  s->code_gen_buffer_size = (size_t)(ptVar2 + (sVar3 - (long)buf));
  tcg_register_jit_m68k(s,buf,(size_t)(ptVar2 + (sVar3 - (long)buf)));
  return;
}

Assistant:

void tcg_prologue_init(TCGContext *s)
{
    size_t prologue_size, total_size;
    void *buf0, *buf1;

    /* Put the prologue at the beginning of code_gen_buffer.  */
    buf0 = s->code_gen_buffer;
    total_size = s->code_gen_buffer_size;
    s->code_ptr = buf0;
    s->code_buf = buf0;
    s->data_gen_ptr = NULL;
    s->code_gen_prologue = buf0;

    /* Compute a high-water mark, at which we voluntarily flush the buffer
       and start over.  The size here is arbitrary, significantly larger
       than we expect the code generation for any one opcode to require.  */
    s->code_gen_highwater = (char *)s->code_gen_buffer + (total_size - TCG_HIGHWATER) - s->uc->qemu_real_host_page_size;

#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

    /* Generate the prologue.  */
    tcg_target_qemu_prologue(s);

#ifdef TCG_TARGET_NEED_POOL_LABELS
    /* Allow the prologue to put e.g. guest_base into a pool entry.  */
    {
        int result = tcg_out_pool_finalize(s);
        tcg_debug_assert(result == 0);
    }
#endif

    buf1 = s->code_ptr;
    flush_icache_range((uintptr_t)buf0, (uintptr_t)buf1);

    /* Deduct the prologue from the buffer.  */
    prologue_size = tcg_current_code_size(s);
    s->code_gen_ptr = buf1;
    s->code_gen_buffer = buf1;
    s->code_buf = buf1;
    total_size -= prologue_size;
    s->code_gen_buffer_size = total_size;

    tcg_register_jit(s, s->code_gen_buffer, total_size);

    /* Assert that goto_ptr is implemented completely.  */
    if (TCG_TARGET_HAS_goto_ptr) {
        tcg_debug_assert(s->code_gen_epilogue != NULL);
    }
}